

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Num.cpp
# Opt level: O0

Halves * __thiscall Num::getHalf(Halves *__return_storage_ptr__,Num *this,Short length)

{
  ushort uVar1;
  ushort uVar2;
  Short SVar3;
  Byte BVar4;
  Num local_1c0;
  Num local_198;
  pair<Num,_Num> local_170;
  ushort local_11c;
  ushort local_11a;
  undefined1 local_118 [4];
  Short i_3;
  Short i_2;
  Num local_f0;
  pair<Num,_Num> local_c8;
  ushort local_76;
  Short i_1;
  ushort local_62;
  string local_60 [6];
  Short i;
  string s2;
  string local_40 [8];
  string s1;
  Short k;
  Short length_local;
  Num *this_local;
  Halves *pair;
  
  uVar1 = length / 2;
  std::pair<Num,_Num>::pair<Num,_Num,_true>(__return_storage_ptr__);
  std::__cxx11::string::string(local_40);
  std::__cxx11::string::string(local_60);
  if ((uint)length % 2 == 0) {
    for (local_11a = 0; local_11c = uVar1, local_11a < uVar1; local_11a = local_11a + 1) {
      BVar4 = getDigit(this,local_11a);
      std::__cxx11::string::operator+=(local_40,(char)BVar4 + '0');
    }
    for (; uVar2 = local_11c, local_11c < (ushort)(uVar1 * 2); local_11c = local_11c + 1) {
      SVar3 = getSize(this);
      if (uVar2 < SVar3) {
        BVar4 = getDigit(this,local_11c);
        std::__cxx11::string::operator+=(local_60,(char)BVar4 + '0');
      }
    }
    SVar3 = std::__cxx11::string::length();
    Num(&local_198,(string *)local_40,SVar3);
    SVar3 = std::__cxx11::string::length();
    Num(&local_1c0,(string *)local_60,SVar3);
    std::pair<Num,_Num>::pair<Num,_Num,_true>(&local_170,&local_198,&local_1c0);
    std::pair<Num,_Num>::operator=(__return_storage_ptr__,&local_170);
    std::pair<Num,_Num>::~pair(&local_170);
    ~Num(&local_1c0);
    ~Num(&local_198);
  }
  else {
    for (local_62 = 0; local_76 = uVar1, local_62 < uVar1; local_62 = local_62 + 1) {
      BVar4 = getDigit(this,local_62);
      std::__cxx11::string::operator+=(local_40,(char)BVar4 + '0');
    }
    for (; uVar2 = local_76, local_76 <= (ushort)(uVar1 * 2); local_76 = local_76 + 1) {
      SVar3 = getSize(this);
      if (uVar2 < SVar3) {
        BVar4 = getDigit(this,local_76);
        std::__cxx11::string::operator+=(local_60,(char)BVar4 + '0');
      }
    }
    SVar3 = std::__cxx11::string::length();
    Num(&local_f0,(string *)local_40,SVar3);
    SVar3 = std::__cxx11::string::length();
    Num((Num *)local_118,(string *)local_60,SVar3);
    std::pair<Num,_Num>::pair<Num,_Num,_true>(&local_c8,&local_f0,(Num *)local_118);
    std::pair<Num,_Num>::operator=(__return_storage_ptr__,&local_c8);
    std::pair<Num,_Num>::~pair(&local_c8);
    ~Num((Num *)local_118);
    ~Num(&local_f0);
  }
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

Halves Num::getHalf(Short length) const  // separate number to halves and reсturn them as a pair of numbers
{
    Short k = length / 2;
    Halves pair;
    std::string s1, s2;
    if (length % 2)
    {
        for (Short i = 0; i < k; ++i)
            s1 += (Num::getDigit(i) + '0');
        for (Short i = k; i <= 2 * k; ++i)
            if (i < getSize())
            {
                s2 += (Num::getDigit(i) + '0');
            }


        pair = {Num(s1, s1.length()), Num(s2,s2.length())};

    }
    else
    {
        for (Short i = 0; i < k; ++i)
            s1 += (Num::getDigit(i) + '0');
        for (Short i = k; i < 2 * k; ++i)
            if (i < getSize())
            {
                s2 += (Num::getDigit(i) + '0');
            }


        pair = {Num(s1, s1.length()), Num(s2, s2.length())};
    }
    return pair;
}